

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_adc_CC(TCGContext_conflict1 *tcg_ctx,int sf,TCGv_i64 dest,TCGv_i64 t0,TCGv_i64 t1)

{
  TCGv_i64 rl;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ah;
  TCGv_i32 ret_01;
  TCGv_i32 ret_02;
  TCGv_i32 ah_00;
  TCGv_i32 tmp_1;
  TCGv_i32 t1_32;
  TCGv_i32 t0_32;
  TCGv_i64 tmp;
  TCGv_i64 vf_64;
  TCGv_i64 cf_64;
  TCGv_i64 result;
  TCGv_i64 t1_local;
  TCGv_i64 t0_local;
  TCGv_i64 dest_local;
  int sf_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (sf == 0) {
    ret_01 = tcg_temp_new_i32(tcg_ctx);
    ret_02 = tcg_temp_new_i32(tcg_ctx);
    ah_00 = tcg_const_i32_aarch64(tcg_ctx,0);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret_01,t0);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret_02,t1);
    tcg_gen_add2_i32_aarch64
              (tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,ret_01,ah_00,tcg_ctx->cpu_CF,ah_00);
    tcg_gen_add2_i32_aarch64
              (tcg_ctx,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,tcg_ctx->cpu_NF,tcg_ctx->cpu_CF,ret_02,ah_00)
    ;
    tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_ZF,tcg_ctx->cpu_NF);
    tcg_gen_xor_i32(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_NF,ret_01);
    tcg_gen_xor_i32(tcg_ctx,ah_00,ret_01,ret_02);
    tcg_gen_andc_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_VF,ah_00);
    tcg_gen_extu_i32_i64_aarch64(tcg_ctx,dest,tcg_ctx->cpu_NF);
    tcg_temp_free_i32(tcg_ctx,ah_00);
    tcg_temp_free_i32(tcg_ctx,ret_02);
    tcg_temp_free_i32(tcg_ctx,ret_01);
  }
  else {
    rl = tcg_temp_new_i64(tcg_ctx);
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    ah = tcg_const_i64_aarch64(tcg_ctx,0);
    tcg_gen_extu_i32_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_CF);
    tcg_gen_add2_i64_aarch64(tcg_ctx,rl,ret,t0,ah,ret,ah);
    tcg_gen_add2_i64_aarch64(tcg_ctx,rl,ret,rl,ret,t1,ah);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,ret);
    gen_set_NZ64(tcg_ctx,rl);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ret_00,rl,t0);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ah,t0,t1);
    tcg_gen_andc_i64_aarch64(tcg_ctx,ret_00,ret_00,ah);
    tcg_gen_extrh_i64_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,ret_00);
    tcg_gen_mov_i64_aarch64(tcg_ctx,dest,rl);
    tcg_temp_free_i64(tcg_ctx,ah);
    tcg_temp_free_i64(tcg_ctx,ret_00);
    tcg_temp_free_i64(tcg_ctx,ret);
    tcg_temp_free_i64(tcg_ctx,rl);
  }
  return;
}

Assistant:

static void gen_adc_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    if (TCG_TARGET_HAS_add2_i32) {
        tcg_gen_movi_i32(tcg_ctx, tmp, 0);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t0, tmp, tcg_ctx->cpu_CF, tmp);
        tcg_gen_add2_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, t1, tmp);
    } else {
        TCGv_i64 q0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 q1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_extu_i32_i64(tcg_ctx, q0, t0);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, t1);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extu_i32_i64(tcg_ctx, q1, tcg_ctx->cpu_CF);
        tcg_gen_add_i64(tcg_ctx, q0, q0, q1);
        tcg_gen_extr_i64_i32(tcg_ctx, tcg_ctx->cpu_NF, tcg_ctx->cpu_CF, q0);
        tcg_temp_free_i64(tcg_ctx, q0);
        tcg_temp_free_i64(tcg_ctx, q1);
    }
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_andc_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}